

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

PClassActor * FindClassTentative(char *name,PClass *ancestor,bool optional)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  PClassActor *ti;
  FName local_24;
  
  if (((name == (char *)0x0) || (*name == '\0')) || (iVar3 = strcasecmp(name,"none"), iVar3 == 0)) {
    return (PClassActor *)0x0;
  }
  FName::FName(&local_24,name);
  ti = (PClassActor *)PClass::FindClassTentative(ancestor,&local_24);
  if (ti == (PClassActor *)0x0) {
    __assert_fail("cls != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0x5b,"PClassActor *FindClassTentative(const char *, PClass *, bool)");
  }
  bVar2 = PClass::IsAncestorOf(ancestor,(PClass *)ti);
  if (!bVar2) {
    I_Error("%s does not inherit from %s\n",name,
            FName::NameData.NameArray
            [(ancestor->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text);
  }
  if (!optional ||
      *(int *)((long)&(ti->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x24) != -1) {
    return ti;
  }
  pbVar1 = (byte *)((long)&(ti->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x21);
  *pbVar1 = *pbVar1 | 8;
  return ti;
}

Assistant:

static PClassActor *FindClassTentative(const char *name, PClass *ancestor, bool optional = false)
{
	// "" and "none" mean 'no class'
	if (name == NULL || *name == 0 || !stricmp(name, "none"))
	{
		return NULL;
	}

	PClass *cls = ancestor->FindClassTentative(name);
	assert(cls != NULL);	// cls can not be NULL here
	if (!cls->IsDescendantOf(ancestor))
	{
		I_Error("%s does not inherit from %s\n", name, ancestor->TypeName.GetChars());
	}
	if (cls->Size == TentativeClass && optional)
	{
		cls->ObjectFlags |= OF_Transient;	// since this flag has no meaning in class types, let's use it for marking the type optional.
	}
	return static_cast<PClassActor *>(cls);
}